

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

void __thiscall
tcu::TextureLevelPyramid::allocLevel
          (TextureLevelPyramid *this,int levelNdx,int width,int height,int depth)

{
  TextureFormat *pTVar1;
  int *piVar2;
  pointer pPVar3;
  int iVar4;
  undefined1 local_58 [24];
  int aiStack_40 [2];
  void *local_38;
  
  iVar4 = TextureFormat::getPixelSize(&this->m_format);
  de::ArrayBuffer<unsigned_char,_1UL,_1UL>::setStorage
            ((this->m_data).
             super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start + levelNdx,
             (long)(iVar4 * depth * height * width));
  ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)local_58,&this->m_format,width,height,depth,
             (this->m_data).
             super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start[levelNdx].m_ptr);
  pPVar3 = (this->m_access).
           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pPVar3[levelNdx].super_ConstPixelBufferAccess.m_data = local_38;
  piVar2 = (int *)((long)pPVar3[levelNdx].super_ConstPixelBufferAccess.m_size.m_data + 8);
  *(undefined8 *)piVar2 = local_58._16_8_;
  *(int (*) [2])(piVar2 + 2) = aiStack_40;
  pTVar1 = (TextureFormat *)(pPVar3 + levelNdx);
  pTVar1->order = local_58._0_4_;
  pTVar1->type = local_58._4_4_;
  pTVar1[1].order = local_58._8_4_;
  pTVar1[1].type = local_58._12_4_;
  return;
}

Assistant:

void TextureLevelPyramid::allocLevel (int levelNdx, int width, int height, int depth)
{
	const int	size	= m_format.getPixelSize()*width*height*depth;

	DE_ASSERT(isLevelEmpty(levelNdx));

	m_data[levelNdx].setStorage(size);
	m_access[levelNdx] = PixelBufferAccess(m_format, width, height, depth, m_data[levelNdx].getPtr());
}